

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

unsigned_long kj::_::convertToReturn<unsigned_long>(ExceptionOr<unsigned_long> *result)

{
  bool bVar1;
  Exception *exception_1;
  
  bVar1 = (result->super_ExceptionOrValue).exception.ptr.isSet;
  if ((result->value).ptr.isSet == true) {
    if (bVar1 != false) {
      throwRecoverableException(&(result->super_ExceptionOrValue).exception.ptr.field_1.value,0);
    }
    return (result->value).ptr.field_1.value;
  }
  if (bVar1 != false) {
    throwFatalException(&(result->super_ExceptionOrValue).exception.ptr.field_1.value,0);
  }
  unreachable();
}

Assistant:

inline T convertToReturn(ExceptionOr<T>&& result) {
  KJ_IF_SOME(value, result.value) {
    KJ_IF_SOME(exception, result.exception) {
      throwRecoverableException(kj::mv(exception));
    }
    return _::returnMaybeVoid(kj::mv(value));
  } else KJ_IF_SOME(exception, result.exception) {
    throwFatalException(kj::mv(exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }